

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O2

void crnlib::Bt3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit;
  UInt32 pos;
  Byte *pBVar1;
  ushort uVar2;
  UInt32 UVar3;
  
  do {
    lenLimit = p->lenLimit;
    if (lenLimit < 3) {
      MatchFinder_MovePos(p);
    }
    else {
      pBVar1 = p->buffer;
      uVar2 = (ushort)p->crc[pBVar1[1]] ^ CONCAT11(*pBVar1,pBVar1[2]);
      UVar3 = p->hash[uVar2];
      pos = p->pos;
      p->hash[uVar2] = pos;
      SkipMatchesSpec(lenLimit,UVar3,pos,p->buffer,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar3 = p->pos + 1;
      p->pos = UVar3;
      if (UVar3 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

void Bt3Zip_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hashValue];
    p->hash[hashValue] = p->pos;
    SKIP_FOOTER
  } while (--num != 0);
}